

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

void vkt::memory::anon_unknown_0::createPipelineWithResources
               (DeviceInterface *vkd,VkDevice device,VkRenderPass renderPass,deUint32 subpass,
               VkShaderModule *vertexShaderModule,VkShaderModule *fragmentShaderModule,
               deUint32 viewPortWidth,deUint32 viewPortHeight,
               vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               *vertexBindingDescriptions,
               vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               *vertexAttributeDescriptions,
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               *bindings,VkPrimitiveTopology topology,deUint32 pushConstantRangeCount,
               VkPushConstantRange *pushConstantRanges,PipelineResources *resources)

{
  VkDescriptorSetLayout obj;
  VkPipelineLayout obj_00;
  VkPipeline obj_01;
  undefined8 uVar1;
  undefined8 uVar2;
  VkDevice pVVar3;
  VkPipelineShaderStageCreateInfo *pVVar4;
  Handle<(vk::HandleType)18> HVar5;
  DeviceInterface *pDVar6;
  VkAllocationCallbacks *pVVar7;
  undefined4 in_register_0000000c;
  ulong uVar8;
  undefined4 in_stack_00000014;
  VkDescriptorSetLayout descriptorSetLayout_;
  VkDescriptorSetLayoutCreateInfo createInfo;
  VkRect2D scissors [1];
  VkPipelineLayoutCreateInfo createInfo_1;
  VkPipelineColorBlendAttachmentState attachments [1];
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkPipelineMultisampleStateCreateInfo multisampleState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkSampleMask local_34c;
  undefined1 local_348 [16];
  VkDevice local_338;
  VkPipelineShaderStageCreateInfo *pVStack_330;
  char *local_328;
  undefined8 local_320;
  undefined4 local_318;
  undefined8 local_310;
  undefined8 local_308;
  deUint64 local_300;
  char *local_2f8;
  undefined8 local_2f0;
  deUint64 local_2e8;
  DeviceInterface *pDStack_2e0;
  VkDevice local_2d8;
  VkAllocationCallbacks *pVStack_2d0;
  VkPipelineRasterizationStateCreateInfo *local_2c8;
  void *pvStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  Move<vk::Handle<(vk::HandleType)18>_> local_288;
  Handle<(vk::HandleType)16> local_268;
  DeviceInterface *pDStack_260;
  VkDevice local_258;
  VkPipelineShaderStageCreateInfo *pVStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  VkRect2D local_1f8;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  VkPipelineRasterizationStateCreateInfo *pVStack_1d0;
  VkPipelineVertexInputStateCreateInfo *local_1c8;
  VkPipelineInputAssemblyStateCreateInfo *local_1c0;
  VkPipelineTessellationStateCreateInfo *local_1b8;
  VkPipelineViewportStateCreateInfo *local_1b0;
  VkPipelineRasterizationStateCreateInfo *local_1a8;
  VkPipelineMultisampleStateCreateInfo *local_1a0;
  VkPipelineDepthStencilStateCreateInfo *local_198;
  VkPipelineColorBlendStateCreateInfo *local_190;
  VkPipelineDynamicStateCreateInfo *local_188;
  VkPipelineLayout local_180;
  VkRenderPass local_178;
  deUint32 local_170;
  VkPipeline local_168;
  deInt32 local_160;
  VkViewport local_158;
  VkPipelineColorBlendAttachmentState local_138;
  VkPipelineInputAssemblyStateCreateInfo local_118;
  VkPipelineMultisampleStateCreateInfo local_f8;
  VkPipelineViewportStateCreateInfo local_c8;
  VkPipelineVertexInputStateCreateInfo local_98;
  VkPipelineColorBlendStateCreateInfo local_68;
  
  if ((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_> *
      )vertexAttributeDescriptions != bindings) {
    local_268.m_internal._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    pDStack_260 = (DeviceInterface *)0x0;
    local_258 = (VkDevice)
                ((ulong)(uint)((int)((ulong)((long)bindings - (long)vertexAttributeDescriptions) >>
                                    3) * -0x55555555) << 0x20);
    pVStack_250 = (VkPipelineShaderStageCreateInfo *)vertexAttributeDescriptions;
    ::vk::createDescriptorSetLayout
              ((Move<vk::Handle<(vk::HandleType)19>_> *)local_348,vkd,device,
               (VkDescriptorSetLayoutCreateInfo *)&local_268,(VkAllocationCallbacks *)0x0);
    pVVar4 = pVStack_330;
    pVVar3 = local_338;
    uVar2 = local_348._8_8_;
    uVar1 = local_348._0_8_;
    local_1d8 = local_338;
    pVStack_1d0 = (VkPipelineRasterizationStateCreateInfo *)pVStack_330;
    local_1e8._0_8_ = local_348._0_8_;
    local_1e8._8_8_ = local_348._8_8_;
    local_348._0_8_ = 0;
    local_348._8_8_ = (DeviceInterface *)0x0;
    local_338 = (VkDevice)0x0;
    pVStack_330 = (VkPipelineShaderStageCreateInfo *)0x0;
    obj.m_internal =
         (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
         object.m_internal;
    if (obj.m_internal == 0) {
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter
      .m_device = pVVar3;
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter
      .m_allocator = (VkAllocationCallbacks *)pVVar4;
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
      m_internal = uVar1;
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter
      .m_deviceIface = (DeviceInterface *)uVar2;
    }
    else {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                (&(resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                  m_data.deleter,obj);
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter
      .m_device = local_1d8;
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter
      .m_allocator = (VkAllocationCallbacks *)pVStack_1d0;
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.
      m_internal = local_1e8._0_8_;
      (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter
      .m_deviceIface = (DeviceInterface *)local_1e8._8_8_;
      if (local_348._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)19>_> *)(local_348 + 8),
                   (VkDescriptorSetLayout)local_348._0_8_);
      }
    }
  }
  local_2c8 = (VkPipelineRasterizationStateCreateInfo *)
              (resources->descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
              .object.m_internal;
  local_1e8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_1e8._8_8_ = (void *)0x0;
  pVStack_1d0 = local_2c8;
  if (local_2c8 != (VkPipelineRasterizationStateCreateInfo *)0x0) {
    pVStack_1d0 = (VkPipelineRasterizationStateCreateInfo *)&local_2c8;
  }
  local_1d8 = (VkDevice)
              ((ulong)(local_2c8 != (VkPipelineRasterizationStateCreateInfo *)0x0) << 0x20);
  local_1c8 = (VkPipelineVertexInputStateCreateInfo *)
              CONCAT44(local_1c8._4_4_,pushConstantRangeCount);
  local_1c0 = (VkPipelineInputAssemblyStateCreateInfo *)pushConstantRanges;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_348,vkd,device,
             (VkPipelineLayoutCreateInfo *)local_1e8,(VkAllocationCallbacks *)0x0);
  pVVar4 = pVStack_330;
  pVVar3 = local_338;
  uVar2 = local_348._8_8_;
  uVar1 = local_348._0_8_;
  local_258 = local_338;
  pVStack_250 = pVStack_330;
  local_268.m_internal = local_348._0_8_;
  pDStack_260 = (DeviceInterface *)local_348._8_8_;
  local_348._0_8_ = 0;
  local_348._8_8_ = (DeviceInterface *)0x0;
  local_338 = (VkDevice)0x0;
  pVStack_330 = (VkPipelineShaderStageCreateInfo *)0x0;
  obj_00.m_internal =
       (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj_00.m_internal == 0) {
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_device = pVVar3;
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVVar4;
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
    m_internal = uVar1;
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar2;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_00);
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_device = local_258;
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)pVStack_250;
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
    m_internal = local_268.m_internal;
    (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = pDStack_260;
    if (local_348._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_348 + 8),
                 (VkPipelineLayout)local_348._0_8_);
    }
  }
  local_348._0_4_ = 0x12;
  local_348._8_8_ = (DeviceInterface *)0x0;
  local_338 = (VkDevice)0x100000000;
  pVStack_330 = *(VkPipelineShaderStageCreateInfo **)CONCAT44(in_register_0000000c,subpass);
  local_328 = "main";
  local_320 = 0;
  local_318 = 0x12;
  local_310 = 0;
  local_308 = 0x1000000000;
  local_300 = vertexShaderModule->m_internal;
  local_2f8 = "main";
  local_2f0 = 0;
  local_198 = (VkPipelineDepthStencilStateCreateInfo *)&local_268;
  pDStack_260 = (DeviceInterface *)0x0;
  local_258 = (VkDevice)0x0;
  uStack_230 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_268.m_internal = 0x19;
  pVStack_250 = (VkPipelineShaderStageCreateInfo *)0x700000000;
  local_238 = 0x700000000;
  local_218 = 7;
  local_208 = 0x3f800000bf800000;
  local_1c8 = &local_98;
  local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_98.pNext = (void *)0x0;
  local_98.flags = 0;
  local_98.pVertexBindingDescriptions =
       *(VkVertexInputBindingDescription **)CONCAT44(in_stack_00000014,viewPortHeight);
  uVar8 = ((long *)CONCAT44(in_stack_00000014,viewPortHeight))[1] -
          (long)local_98.pVertexBindingDescriptions;
  if (uVar8 == 0) {
    local_98.pVertexBindingDescriptions =
         (VkVertexInputBindingDescription *)(VkVertexInputAttributeDescription *)0x0;
  }
  local_98.vertexBindingDescriptionCount = (int)(uVar8 >> 2) * -0x55555555;
  local_98.pVertexAttributeDescriptions =
       (VkVertexInputAttributeDescription *)
       (vertexBindingDescriptions->
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (long)(vertexBindingDescriptions->
                super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.pVertexAttributeDescriptions;
  if (uVar8 == 0) {
    local_98.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  }
  local_98.vertexAttributeDescriptionCount = (deUint32)(uVar8 >> 4);
  local_1c0 = &local_118;
  local_118.pNext = (void *)0x0;
  local_118.primitiveRestartEnable = 0;
  local_118._28_4_ = 0;
  local_118.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_118._4_4_ = 0;
  local_118._16_8_ = (ulong)topology << 0x20;
  local_c8.pViewports = &local_158;
  local_158.x = 0.0;
  local_158.y = 0.0;
  local_1f8.extent.width = (deUint32)fragmentShaderModule;
  local_158.width = (float)((ulong)fragmentShaderModule & 0xffffffff);
  local_158.height = (float)viewPortWidth;
  local_158.minDepth = 0.0;
  local_158.maxDepth = 1.0;
  local_c8.pScissors = &local_1f8;
  local_1f8.offset.x = 0;
  local_1f8.offset.y = 0;
  local_1f8.extent.height = viewPortWidth;
  local_1b0 = &local_c8;
  local_c8.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_c8.pNext = (void *)0x0;
  local_c8.flags = 0;
  local_c8.viewportCount = 1;
  local_c8.scissorCount = 1;
  pvStack_2c0 = (void *)0x0;
  uStack_2b0._0_4_ = 0;
  uStack_2b0._4_4_ = VK_POLYGON_MODE_FILL;
  local_298._0_4_ = 0.0;
  local_298._4_4_ = 0.0;
  local_2a8._0_4_ = 0;
  local_2a8._4_4_ = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  uStack_2a0._0_4_ = 0;
  uStack_2a0._4_4_ = 0.0;
  local_2c8 = (VkPipelineRasterizationStateCreateInfo *)0x17;
  local_2b8._0_4_ = 0;
  local_2b8._4_4_ = 1;
  uStack_290._0_4_ = 1.0;
  uStack_290._4_4_ = 0;
  local_f8.pSampleMask = &local_34c;
  local_34c = 0xffffffff;
  local_1a0 = &local_f8;
  local_f8.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_f8.pNext = (void *)0x0;
  local_f8.flags = 0;
  local_f8.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_f8.sampleShadingEnable = 0;
  local_f8.minSampleShading = 0.0;
  local_f8.alphaToCoverageEnable = 0;
  local_f8.alphaToOneEnable = 0;
  local_68.pAttachments = &local_138;
  local_138.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_138.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_138.alphaBlendOp = VK_BLEND_OP_ADD;
  local_138.colorWriteMask = 0xf;
  local_138.blendEnable = 0;
  local_138.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_138.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_138.colorBlendOp = VK_BLEND_OP_ADD;
  local_190 = &local_68;
  local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 0;
  local_68.logicOpEnable = 0;
  local_68.logicOp = VK_LOGIC_OP_COPY;
  local_68.attachmentCount = 1;
  local_68.blendConstants[0] = 0.0;
  local_68.blendConstants[1] = 0.0;
  local_68.blendConstants[2] = 0.0;
  local_68.blendConstants[3] = 0.0;
  local_1e8._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_1e8._8_8_ = (void *)0x0;
  local_1d8._0_4_ = 0;
  local_1d8._4_4_ = 2;
  local_1b8 = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_1a8 = (VkPipelineRasterizationStateCreateInfo *)&local_2c8;
  local_188 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_180.m_internal =
       (resources->pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  local_170 = 0;
  local_168.m_internal = 0;
  local_160 = 0;
  pVStack_1d0 = (VkPipelineRasterizationStateCreateInfo *)local_348;
  local_178.m_internal = renderPass.m_internal;
  ::vk::createGraphicsPipeline
            (&local_288,vkd,device,(VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)local_1e8,
             (VkAllocationCallbacks *)0x0);
  pVVar7 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar3 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar6 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar5.m_internal =
       local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_2d8 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pVStack_2d0 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_2e8 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  pDStack_2e0 = local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                m_deviceIface;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_01.m_internal =
       (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal
  ;
  if (obj_01.m_internal == 0) {
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         pVVar3;
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
         = pVVar7;
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         HVar5.m_internal;
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = pDVar6;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_01);
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         local_2d8;
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
         = pVStack_2d0;
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         local_2e8;
    (resources->pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = pDStack_2e0;
    if (local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_288.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  return;
}

Assistant:

void createPipelineWithResources (const vk::DeviceInterface&							vkd,
								  const vk::VkDevice									device,
								  const vk::VkRenderPass								renderPass,
								  const deUint32										subpass,
								  const vk::VkShaderModule&								vertexShaderModule,
								  const vk::VkShaderModule&								fragmentShaderModule,
								  const deUint32										viewPortWidth,
								  const deUint32										viewPortHeight,
								  const vector<vk::VkVertexInputBindingDescription>&	vertexBindingDescriptions,
								  const vector<vk::VkVertexInputAttributeDescription>&	vertexAttributeDescriptions,
								  const vector<vk::VkDescriptorSetLayoutBinding>&		bindings,
								  const vk::VkPrimitiveTopology							topology,
								  deUint32												pushConstantRangeCount,
								  const vk::VkPushConstantRange*						pushConstantRanges,
								  PipelineResources&									resources)
{
	if (!bindings.empty())
	{
		const vk::VkDescriptorSetLayoutCreateInfo createInfo =
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,

			0u,
			(deUint32)bindings.size(),
			bindings.empty() ? DE_NULL : &bindings[0]
		};

		resources.descriptorSetLayout = vk::createDescriptorSetLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			descriptorSetLayout_	= *resources.descriptorSetLayout;
		const vk::VkPipelineLayoutCreateInfo	createInfo				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,
			DE_NULL,
			0,

			resources.descriptorSetLayout ? 1u : 0u,
			resources.descriptorSetLayout ? &descriptorSetLayout_ : DE_NULL,

			pushConstantRangeCount,
			pushConstantRanges
		};

		resources.pipelineLayout = vk::createPipelineLayout(vkd, device, &createInfo);
	}

	{
		const vk::VkPipelineShaderStageCreateInfo			shaderStages[]					=
		{
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_VERTEX_BIT,
				vertexShaderModule,
				"main",
				DE_NULL
			},
			{
				vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,
				DE_NULL,
				0,
				vk::VK_SHADER_STAGE_FRAGMENT_BIT,
				fragmentShaderModule,
				"main",
				DE_NULL
			}
		};
		const vk::VkPipelineDepthStencilStateCreateInfo		depthStencilState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,
			DE_NULL,
			0u,
			DE_FALSE,
			DE_FALSE,
			vk::VK_COMPARE_OP_ALWAYS,
			DE_FALSE,
			DE_FALSE,
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			{
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_STENCIL_OP_KEEP,
				vk::VK_COMPARE_OP_ALWAYS,
				0u,
				0u,
				0u,
			},
			-1.0f,
			+1.0f
		};
		const vk::VkPipelineVertexInputStateCreateInfo		vertexInputState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,
			DE_NULL,
			0u,

			(deUint32)vertexBindingDescriptions.size(),
			vertexBindingDescriptions.empty() ? DE_NULL : &vertexBindingDescriptions[0],

			(deUint32)vertexAttributeDescriptions.size(),
			vertexAttributeDescriptions.empty() ? DE_NULL : &vertexAttributeDescriptions[0]
		};
		const vk::VkPipelineInputAssemblyStateCreateInfo	inputAssemblyState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,
			DE_NULL,
			0,
			topology,
			VK_FALSE
		};
		const vk::VkViewport								viewports[]						=
		{
			{ 0.0f, 0.0f, (float)viewPortWidth, (float)viewPortHeight, 0.0f, 1.0f }
		};
		const vk::VkRect2D									scissors[]						=
		{
			{ { 0, 0 }, { (deUint32)viewPortWidth, (deUint32)viewPortHeight } }
		};
		const vk::VkPipelineViewportStateCreateInfo			viewportState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,
			DE_NULL,
			0,
			DE_LENGTH_OF_ARRAY(viewports),
			viewports,
			DE_LENGTH_OF_ARRAY(scissors),
			scissors
		};
		const vk::VkPipelineRasterizationStateCreateInfo	rasterState						=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_TRUE,
			VK_FALSE,
			vk::VK_POLYGON_MODE_FILL,
			vk::VK_CULL_MODE_NONE,
			vk::VK_FRONT_FACE_COUNTER_CLOCKWISE,
			VK_FALSE,
			0.0f,
			0.0f,
			0.0f,
			1.0f
		};
		const vk::VkSampleMask								sampleMask						= ~0u;
		const vk::VkPipelineMultisampleStateCreateInfo		multisampleState				=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,
			DE_NULL,
			0,

			vk::VK_SAMPLE_COUNT_1_BIT,
			VK_FALSE,
			0.0f,
			&sampleMask,
			VK_FALSE,
			VK_FALSE
		};
		const vk::VkPipelineColorBlendAttachmentState		attachments[]					=
		{
			{
				VK_FALSE,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				vk::VK_BLEND_FACTOR_ONE,
				vk::VK_BLEND_FACTOR_ZERO,
				vk::VK_BLEND_OP_ADD,
				(vk::VK_COLOR_COMPONENT_R_BIT|
				 vk::VK_COLOR_COMPONENT_G_BIT|
				 vk::VK_COLOR_COMPONENT_B_BIT|
				 vk::VK_COLOR_COMPONENT_A_BIT)
			}
		};
		const vk::VkPipelineColorBlendStateCreateInfo		colorBlendState					=
		{
			vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,
			DE_NULL,
			0,

			VK_FALSE,
			vk::VK_LOGIC_OP_COPY,
			DE_LENGTH_OF_ARRAY(attachments),
			attachments,
			{ 0.0f, 0.0f, 0.0f, 0.0f }
		};
		const vk::VkGraphicsPipelineCreateInfo				createInfo						=
		{
			vk::VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,
			DE_NULL,
			0u,

			DE_LENGTH_OF_ARRAY(shaderStages),
			shaderStages,

			&vertexInputState,
			&inputAssemblyState,
			DE_NULL,
			&viewportState,
			&rasterState,
			&multisampleState,
			&depthStencilState,
			&colorBlendState,
			DE_NULL,
			*resources.pipelineLayout,
			renderPass,
			subpass,
			0,
			0
		};

		resources.pipeline = vk::createGraphicsPipeline(vkd, device, 0, &createInfo);
	}
}